

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

char * __thiscall leveldb::Arena::AllocateNewBlock(Arena *this,size_t block_bytes)

{
  char *local_48;
  char *result;
  size_t block_bytes_local;
  Arena *this_local;
  
  result = (char *)block_bytes;
  block_bytes_local = (size_t)this;
  local_48 = (char *)operator_new__(block_bytes);
  std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->blocks_,&local_48);
  LOCK();
  (this->memory_usage_).super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict1)
       (result + (this->memory_usage_).super___atomic_base<unsigned_long>._M_i + 8);
  UNLOCK();
  return local_48;
}

Assistant:

char* Arena::AllocateNewBlock(size_t block_bytes) {
  char* result = new char[block_bytes];
  blocks_.push_back(result);
  memory_usage_.fetch_add(block_bytes + sizeof(char*),
                          std::memory_order_relaxed);
  return result;
}